

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

bool __thiscall
MemoryLeakDetector::validMemoryCorruptionInformation(MemoryLeakDetector *this,char *memory)

{
  byte bVar1;
  
  if ((*memory == 'B') && (memory[1] == 'A')) {
    bVar1 = -(memory[2] == 'S');
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool MemoryLeakDetector::validMemoryCorruptionInformation(char* memory)
{
   for (size_t i=0; i<memory_corruption_buffer_size; i++)
      if (memory[i] != GuardBytes[i % sizeof(GuardBytes)])
          return false;
   return true;
}